

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> __thiscall
llvm::yaml::Input::createHNodes(Input *this,Node *N)

{
  __uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> _Var1;
  bool bVar2;
  ret_type pSVar3;
  ret_type pBVar4;
  Child CVar5;
  ret_type C;
  ret_type C_00;
  KeyValueNode *this_00;
  Node *Val;
  Node *pNVar6;
  Child *pCVar7;
  Node *in_RDX;
  StringRef Key;
  undefined1 local_108 [8];
  SmallString<128U> StringStorage;
  Child CStack_70;
  iterator __begin4;
  undefined1 local_60 [8];
  iterator __begin5;
  undefined1 local_50 [8];
  StringRef ValueCopy;
  Node *local_38;
  Node *N_local;
  
  local_108 = (undefined1  [8])
              &StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
  StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_38 = in_RDX;
  pSVar3 = dyn_cast<llvm::yaml::ScalarNode,llvm::yaml::Node>(in_RDX);
  if (pSVar3 == (ret_type)0x0) {
    pBVar4 = dyn_cast<llvm::yaml::BlockScalarNode,llvm::yaml::Node>(in_RDX);
    if (pBVar4 == (ret_type)0x0) {
      C = dyn_cast<llvm::yaml::SequenceNode,llvm::yaml::Node>(local_38);
      if (C == (ret_type)0x0) {
        C_00 = dyn_cast<llvm::yaml::MappingNode,llvm::yaml::Node>(local_38);
        if (C_00 != (ret_type)0x0) {
          std::make_unique<llvm::yaml::Input::MapHNode,llvm::yaml::Node*&>
                    ((Node **)&CStack_70.twine);
          local_60 = (undefined1  [8])begin<llvm::yaml::MappingNode>(C_00);
          StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
          InlineElts._120_8_ = &N[1].Anchor;
          __begin5.Base = (MappingNode *)this;
          while (CVar5 = CStack_70, local_60 != (undefined1  [8])0x0) {
            this_00 = basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                      operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                 *)local_60);
            Val = KeyValueNode::getKey(this_00);
            pSVar3 = dyn_cast_or_null<llvm::yaml::ScalarNode,llvm::yaml::Node>(Val);
            pNVar6 = KeyValueNode::getValue(this_00);
            this = (Input *)__begin5;
            if ((pSVar3 == (ret_type)0x0) || (pNVar6 == (Node *)0x0)) {
              if (pSVar3 == (ret_type)0x0) {
                Twine::Twine((Twine *)local_50,"Map key must be a scalar");
                setError((Input *)N,Val,(Twine *)local_50);
              }
              CVar5 = CStack_70;
              if (pNVar6 == (Node *)0x0) {
                Twine::Twine((Twine *)local_50,"Map value must not be empty");
                setError((Input *)N,Val,(Twine *)local_50);
                CVar5 = CStack_70;
              }
              break;
            }
            StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 (void *)((ulong)StringStorage.super_SmallVector<char,_128U>.
                                 super_SmallVectorImpl<char>.
                                 super_SmallVectorTemplateBase<char,_true>.
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX & 0xffffffff00000000);
            Key = ScalarNode::getValue(pSVar3,(SmallVectorImpl<char> *)local_108);
            if (((ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
                0xffffffff) != 0) {
              ValueCopy.Data =
                   (char *)((ulong)StringStorage.super_SmallVector<char,_128U>.
                                   super_SmallVectorImpl<char>.
                                   super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX & 0xffffffff);
              local_50 = local_108;
              Key = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                              ((StringRef *)local_50,
                               (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                               StringStorage.super_SmallVector<char,_128U>.
                               super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
            }
            createHNodes((Input *)local_50,N);
            if (*(int *)&N[1].SourceRange.End.Ptr != 0) {
              CVar5 = CStack_70;
              this = (Input *)__begin5;
              if (local_50 != (undefined1  [8])0x0) {
                (**(code **)(*(unsigned_long *)local_50 + 0x10))();
                CVar5 = CStack_70;
                this = (Input *)__begin5;
              }
              break;
            }
            pCVar7 = (Child *)StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                              ::operator[]((StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                                            *)&(CStack_70.formatvObject)->Adapters,Key);
            _Var1._M_t.
            super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
            .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl =
                 (tuple<llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>)
                 pCVar7->decUL;
            *pCVar7 = (Child)local_50;
            if ((__uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                 )_Var1._M_t.
                  super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
                  .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                 )0x0) {
              (**(code **)(*(long *)_Var1._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
                                    .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>.
                                    _M_head_impl + 0x10))();
            }
            this = (Input *)__begin5.Base;
            basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                      ((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                        *)local_60);
          }
          goto LAB_00dcd541;
        }
        bVar2 = isa_impl_cl<llvm::yaml::NullNode,_const_llvm::yaml::Node_*>::doit(local_38);
        if (!bVar2) {
          Twine::Twine((Twine *)local_50,"unknown node kind");
          setError((Input *)N,local_38,(Twine *)local_50);
          (this->super_IO)._vptr_IO = (_func_int **)0x0;
          goto LAB_00dcd544;
        }
        std::make_unique<llvm::yaml::Input::EmptyHNode,llvm::yaml::Node*&>((Node **)local_50);
      }
      else {
        std::make_unique<llvm::yaml::Input::SequenceHNode,llvm::yaml::Node*&>((Node **)local_50);
        CStack_70 = (Child)begin<llvm::yaml::SequenceNode>(C);
        while ((SequenceNode *)CStack_70.twine != (SequenceNode *)0x0) {
          basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator*
                    ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)
                     &CStack_70);
          createHNodes((Input *)local_60,N);
          if (*(int *)&N[1].SourceRange.End.Ptr != 0) {
            if (local_60 != (undefined1  [8])0x0) {
              (*((Node *)local_60)->_vptr_Node[2])();
            }
            break;
          }
          std::
          vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
          ::
          emplace_back<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>
                    ((vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
                      *)((long)local_50 + 0x10),
                     (unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                      *)local_60);
          if (local_60 != (undefined1  [8])0x0) {
            (*((Node *)local_60)->_vptr_Node[2])();
          }
          basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
                    ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)
                     &CStack_70);
        }
      }
      CVar5 = (Child)local_50;
    }
    else {
      CStack_70 = (Child)(pBVar4->Value).Data;
      __begin4.Base = (SequenceNode *)(pBVar4->Value).Length;
      _local_50 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                            ((StringRef *)&CStack_70,
                             (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                             &N[1].Anchor);
      std::make_unique<llvm::yaml::Input::ScalarHNode,llvm::yaml::Node*&,llvm::StringRef&>
                ((Node **)&CStack_70.twine,(StringRef *)&stack0xffffffffffffffc8);
      CVar5 = CStack_70;
    }
  }
  else {
    _local_50 = ScalarNode::getValue(pSVar3,(SmallVectorImpl<char> *)local_108);
    if ((SequenceNode *)
        ((ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
        0xffffffff) != (SequenceNode *)0x0) {
      CStack_70.twine = (Twine *)local_108;
      __begin4.Base =
           (SequenceNode *)
           ((ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
           0xffffffff);
      _local_50 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                            ((StringRef *)&CStack_70,
                             (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                             &N[1].Anchor);
    }
    std::make_unique<llvm::yaml::Input::ScalarHNode,llvm::yaml::Node*&,llvm::StringRef&>
              ((Node **)&CStack_70.twine,(StringRef *)&stack0xffffffffffffffc8);
    CVar5 = CStack_70;
  }
LAB_00dcd541:
  *(Child *)this = CVar5;
LAB_00dcd544:
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_108);
  return (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
          )(tuple<llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>)this;
}

Assistant:

std::unique_ptr<Input::HNode> Input::createHNodes(Node *N) {
  SmallString<128> StringStorage;
  if (ScalarNode *SN = dyn_cast<ScalarNode>(N)) {
    StringRef KeyStr = SN->getValue(StringStorage);
    if (!StringStorage.empty()) {
      // Copy string to permanent storage
      KeyStr = StringStorage.str().copy(StringAllocator);
    }
    return std::make_unique<ScalarHNode>(N, KeyStr);
  } else if (BlockScalarNode *BSN = dyn_cast<BlockScalarNode>(N)) {
    StringRef ValueCopy = BSN->getValue().copy(StringAllocator);
    return std::make_unique<ScalarHNode>(N, ValueCopy);
  } else if (SequenceNode *SQ = dyn_cast<SequenceNode>(N)) {
    auto SQHNode = std::make_unique<SequenceHNode>(N);
    for (Node &SN : *SQ) {
      auto Entry = createHNodes(&SN);
      if (EC)
        break;
      SQHNode->Entries.push_back(std::move(Entry));
    }
    return std::move(SQHNode);
  } else if (MappingNode *Map = dyn_cast<MappingNode>(N)) {
    auto mapHNode = std::make_unique<MapHNode>(N);
    for (KeyValueNode &KVN : *Map) {
      Node *KeyNode = KVN.getKey();
      ScalarNode *Key = dyn_cast_or_null<ScalarNode>(KeyNode);
      Node *Value = KVN.getValue();
      if (!Key || !Value) {
        if (!Key)
          setError(KeyNode, "Map key must be a scalar");
        if (!Value)
          setError(KeyNode, "Map value must not be empty");
        break;
      }
      StringStorage.clear();
      StringRef KeyStr = Key->getValue(StringStorage);
      if (!StringStorage.empty()) {
        // Copy string to permanent storage
        KeyStr = StringStorage.str().copy(StringAllocator);
      }
      auto ValueHNode = createHNodes(Value);
      if (EC)
        break;
      mapHNode->Mapping[KeyStr] = std::move(ValueHNode);
    }
    return std::move(mapHNode);
  } else if (isa<NullNode>(N)) {
    return std::make_unique<EmptyHNode>(N);
  } else {
    setError(N, "unknown node kind");
    return nullptr;
  }
}